

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void clog::concurrentFunc(void)

{
  size_t sVar1;
  undefined1 local_a0 [40];
  type str_1;
  int local_5c;
  int i;
  int size;
  undefined1 local_48 [40];
  type str;
  
  while ((_runing & 1) != 0) {
    BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::take((BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_48);
    std::__cxx11::string::string((string *)(local_48 + 0x20),(string *)local_48);
    std::__cxx11::string::~string((string *)local_48);
    defaultOutput((string *)(local_48 + 0x20));
    std::__cxx11::string::~string((string *)(local_48 + 0x20));
  }
  sVar1 = BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)queue_abi_cxx11_);
  if ((int)sVar1 != 0) {
    for (local_5c = 0; local_5c < (int)sVar1; local_5c = local_5c + 1) {
      BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::take((BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_a0);
      std::__cxx11::string::string((string *)(local_a0 + 0x20),(string *)local_a0);
      std::__cxx11::string::~string((string *)local_a0);
      defaultOutput((string *)(local_a0 + 0x20));
      std::__cxx11::string::~string((string *)(local_a0 + 0x20));
    }
  }
  return;
}

Assistant:

void concurrentFunc()  // 多线程场景下单独使用一个线程来写日志
{
    while (_runing)
    {
        auto str(std::move(queue.take()));
        defaultOutput(str);
    }

    int size;

    if((size = queue.size()) != 0)
    {
        for (int i=0; i<size; ++i)
        {
            auto str(std::move(queue.take()));
            defaultOutput(str);
        }
    }
}